

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  size_t sVar2;
  Colour colourGuard;
  char local_21;
  
  poVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001aa1b0 = 0x2d2d2d2d2d2d2d;
    uRam00000000001aa1b7._0_1_ = '-';
    uRam00000000001aa1b7._1_1_ = '-';
    uRam00000000001aa1b7._2_1_ = '-';
    uRam00000000001aa1b7._3_1_ = '-';
    uRam00000000001aa1b7._4_1_ = '-';
    uRam00000000001aa1b7._5_1_ = '-';
    uRam00000000001aa1b7._6_1_ = '-';
    uRam00000000001aa1b7._7_1_ = '-';
    DAT_001aa1a0 = '-';
    DAT_001aa1a0_1._0_1_ = '-';
    DAT_001aa1a0_1._1_1_ = '-';
    DAT_001aa1a0_1._2_1_ = '-';
    DAT_001aa1a0_1._3_1_ = '-';
    DAT_001aa1a0_1._4_1_ = '-';
    DAT_001aa1a0_1._5_1_ = '-';
    DAT_001aa1a0_1._6_1_ = '-';
    uRam00000000001aa1a8 = 0x2d2d2d2d2d2d2d;
    DAT_001aa1af = 0x2d;
    DAT_001aa190 = '-';
    DAT_001aa190_1._0_1_ = '-';
    DAT_001aa190_1._1_1_ = '-';
    DAT_001aa190_1._2_1_ = '-';
    DAT_001aa190_1._3_1_ = '-';
    DAT_001aa190_1._4_1_ = '-';
    DAT_001aa190_1._5_1_ = '-';
    DAT_001aa190_1._6_1_ = '-';
    uRam00000000001aa198._0_1_ = '-';
    uRam00000000001aa198._1_1_ = '-';
    uRam00000000001aa198._2_1_ = '-';
    uRam00000000001aa198._3_1_ = '-';
    uRam00000000001aa198._4_1_ = '-';
    uRam00000000001aa198._5_1_ = '-';
    uRam00000000001aa198._6_1_ = '-';
    uRam00000000001aa198._7_1_ = '-';
    DAT_001aa180 = '-';
    DAT_001aa180_1._0_1_ = '-';
    DAT_001aa180_1._1_1_ = '-';
    DAT_001aa180_1._2_1_ = '-';
    DAT_001aa180_1._3_1_ = '-';
    DAT_001aa180_1._4_1_ = '-';
    DAT_001aa180_1._5_1_ = '-';
    DAT_001aa180_1._6_1_ = '-';
    uRam00000000001aa188._0_1_ = '-';
    uRam00000000001aa188._1_1_ = '-';
    uRam00000000001aa188._2_1_ = '-';
    uRam00000000001aa188._3_1_ = '-';
    uRam00000000001aa188._4_1_ = '-';
    uRam00000000001aa188._5_1_ = '-';
    uRam00000000001aa188._6_1_ = '-';
    uRam00000000001aa188._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000001aa178._0_1_ = '-';
    uRam00000000001aa178._1_1_ = '-';
    uRam00000000001aa178._2_1_ = '-';
    uRam00000000001aa178._3_1_ = '-';
    uRam00000000001aa178._4_1_ = '-';
    uRam00000000001aa178._5_1_ = '-';
    uRam00000000001aa178._6_1_ = '-';
    uRam00000000001aa178._7_1_ = '-';
    DAT_001aa1bf = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_21,1);
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::use(None);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}